

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O0

bool __thiscall rtc::CriticalSection::CurrentThreadIsOwner(CriticalSection *this)

{
  bool bVar1;
  PlatformThreadRef local_18;
  CriticalSection *local_10;
  CriticalSection *this_local;
  
  local_10 = this;
  local_18 = CurrentThreadRef();
  bVar1 = IsThreadRefEqual(&this->thread_,&local_18);
  return bVar1;
}

Assistant:

bool CriticalSection::CurrentThreadIsOwner() const {
#if defined(WEBRTC_WIN)
  // OwningThread has type HANDLE but actually contains the Thread ID:
  // http://stackoverflow.com/questions/12675301/why-is-the-owningthread-member-of-critical-section-of-type-handle-when-it-is-de
  // Converting through size_t avoids the VS 2015 warning C4312: conversion from
  // 'type1' to 'type2' of greater size
  return crit_.OwningThread ==
         reinterpret_cast<HANDLE>(static_cast<size_t>(GetCurrentThreadId()));
#else
#if CS_DEBUG_CHECKS
  return IsThreadRefEqual(thread_, CurrentThreadRef());
#else
  return true;
#endif  // CS_DEBUG_CHECKS
#endif
}